

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall
Lowerer::LoadScriptContextValueOpnd(Lowerer *this,Instr *instr,ScriptContextValue valueType)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ScriptContextInfo *pSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 *puVar5;
  ScriptContextInfo *scriptContextInfo;
  ScriptContextValue valueType_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pSVar4 = Func::GetScriptContextInfo(instr->m_func);
  if (valueType == ScriptContextNumberAllocator) {
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0x1b])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var,iVar3),AddrOpndKindDynamicMisc,
                                   instr->m_func,false,(Var)0x0);
  }
  else if (valueType == ScriptContextRecycler) {
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0x1c])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar3),AddrOpndKindDynamicMisc,
                                   instr->m_func,false,(Var)0x0);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0xc68,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    this_local = (Lowerer *)0x0;
  }
  return (Opnd *)this_local;
}

Assistant:

IR::Opnd *
Lowerer::LoadScriptContextValueOpnd(IR::Instr * instr, ScriptContextValue valueType)
{
    ScriptContextInfo *scriptContextInfo = instr->m_func->GetScriptContextInfo();
    switch (valueType)
    {
    case ScriptContextValue::ScriptContextNumberAllocator:
        return IR::AddrOpnd::New(scriptContextInfo->GetNumberAllocatorAddr(), IR::AddrOpndKindDynamicMisc, instr->m_func);
    case ScriptContextValue::ScriptContextRecycler:
        return IR::AddrOpnd::New(scriptContextInfo->GetRecyclerAddr(), IR::AddrOpndKindDynamicMisc, instr->m_func);
    default:
        Assert(false);
        return nullptr;
    }

}